

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_assertion_tests.cpp
# Opt level: O2

void __thiscall
test::string_assertion_test::iu_StrCaseTest_x_iutest_x_EqRaw_Test<char>::Body
          (iu_StrCaseTest_x_iutest_x_EqRaw_Test<char> *this)

{
  char *val2;
  AssertionResult iutest_ar;
  AssertionResult local_1f0;
  iuCodeMessage local_1c8;
  Fixed local_198;
  
  val2 = text<char>::test;
  iutest::internal::CmpHelperSTRCASEEQ
            (&local_1f0,"TestFixture::Text::test","p",text<char>::test,text<char>::test);
  if (local_1f0.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0xad,local_1f0.m_message._M_dataplus._M_p);
    local_1c8._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,&local_198);
  }
  else {
    std::__cxx11::string::~string((string *)&local_1f0);
    iutest::internal::CmpHelperSTRCASEEQ
              (&local_1f0,"TestFixture::Text::test","p",text<char>::test,val2);
    if (local_1f0.m_result == false) {
      memset(&local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_198);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
                 ,0xae,local_1f0.m_message._M_dataplus._M_p);
      local_1c8._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,&local_198);
      std::__cxx11::string::~string((string *)&local_1c8);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_198);
    }
    std::__cxx11::string::~string((string *)&local_1f0);
    iutest::internal::CmpHelperSTRCASEEQ
              (&local_1f0,"TestFixture::Text::test","p",text<char>::test,val2);
    if (local_1f0.m_result != false) goto LAB_002da8d9;
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0xaf,local_1f0.m_message._M_dataplus._M_p);
    local_1c8._44_4_ = 0xffffffff;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,&local_198);
  }
  std::__cxx11::string::~string((string *)&local_1c8);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_198);
LAB_002da8d9:
  std::__cxx11::string::~string((string *)&local_1f0);
  return;
}

Assistant:

IUTEST_TYPED_TEST(StrCaseTest, EqRaw)
{
    const TypeParam* p = TestFixture::Text::test;
    IUTEST_ASSERT_STRCASEEQ(TestFixture::Text::test, p);
    IUTEST_EXPECT_STRCASEEQ(TestFixture::Text::test, p);
    IUTEST_INFORM_STRCASEEQ(TestFixture::Text::test, p);
}